

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

int __thiscall KryoFlux::EnableMotor(KryoFlux *this,int enable)

{
  int iVar1;
  string local_30;
  
  (**(code **)(*(long *)this + 0x18))(&local_30,this,7,enable,0);
  iVar1 = ResponseCode(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int KryoFlux::EnableMotor(int enable)
{
    return ResponseCode(Control(REQ_MOTOR, enable));
}